

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::QualifiedFileLevelSymbol
                   (string *__return_storage_ptr__,FileDescriptor *file,string *name,
                   Options *options)

{
  ulong uVar1;
  AlphaNum *in_R8;
  AlphaNum local_148;
  AlphaNum local_118;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  Options *local_28;
  Options *options_local;
  string *name_local;
  FileDescriptor *file_local;
  
  local_28 = options;
  options_local = (Options *)name;
  name_local = (string *)file;
  file_local = (FileDescriptor *)__return_storage_ptr__;
  FileDescriptor::package_abi_cxx11_(file);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Namespace_abi_cxx11_(&local_d8,(cpp *)name_local,(FileDescriptor *)local_28,options);
    strings::AlphaNum::AlphaNum(&local_b8,&local_d8);
    strings::AlphaNum::AlphaNum(&local_118,"::");
    strings::AlphaNum::AlphaNum(&local_148,&options_local->dllexport_decl);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_b8,&local_118,&local_148,in_R8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    strings::AlphaNum::AlphaNum(&local_58,"::");
    strings::AlphaNum::AlphaNum(&local_88,&options_local->dllexport_decl);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_58,&local_88,(AlphaNum *)options);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedFileLevelSymbol(const FileDescriptor* file,
                                     const std::string& name,
                                     const Options& options) {
  if (file->package().empty()) {
    return StrCat("::", name);
  }
  return StrCat(Namespace(file, options), "::", name);
}